

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O3

Result * __thiscall
testing::
Action<ot::commissioner::Error(std::function<void(ot::commissioner::BorderAgent_const*,ot::commissioner::Error_const&)>,unsigned_long,std::__cxx11::string_const&)>
::ActionAdapter::operator()
          (Result *__return_storage_ptr__,void *this,
          function<void_(const_ot::commissioner::BorderAgent_*,_const_ot::commissioner::Error_&)>
          *args,unsigned_long *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2)

{
  long *plVar1;
  _Manager_type p_Var2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  unsigned_long local_38;
  _Any_data local_30;
  _Manager_type local_20;
  _Invoker_type local_18;
  
  plVar1 = *this;
  local_38 = *args_1;
  local_30._M_unused._M_object = (void *)0x0;
  local_30._8_8_ = 0;
  local_20 = (_Manager_type)0x0;
  local_18 = args->_M_invoker;
  p_Var2 = (args->super__Function_base)._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_30._M_unused._0_8_ = (undefined8)*(undefined8 *)&(args->super__Function_base)._M_functor;
    local_30._8_8_ = *(undefined8 *)((long)&(args->super__Function_base)._M_functor + 8);
    (args->super__Function_base)._M_manager = (_Manager_type)0x0;
    args->_M_invoker = (_Invoker_type)0x0;
    local_20 = p_Var2;
  }
  local_40 = args_2;
  (**(code **)(*plVar1 + 0x10))(__return_storage_ptr__,plVar1,&local_40);
  if (local_20 != (_Manager_type)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

typename internal::Function<F>::Result operator()(Args&&... args) {
      return impl_->Perform(
          ::std::forward_as_tuple(::std::forward<Args>(args)...));
    }